

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_OneStringAgain_Test::TestBody(TApp_OneStringAgain_Test *this)

{
  App *this_00;
  long lVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  allocator local_109;
  AssertHelper local_108;
  AssertionResult gtest_ar;
  string local_e0 [32];
  string str;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_40,"-s,--string",(allocator *)&gtest_ar);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_118);
  this_00 = &(this->super_TApp).app;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_40,&str,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&gtest_ar,"--string",(allocator *)&local_118);
  std::__cxx11::string::string(local_e0,"mystring",(allocator *)&local_108);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&gtest_ar,&str);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  local_118.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_80,"-s",&local_109);
  local_108.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_80);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"-s\")",(unsigned_long *)&local_118,
             (unsigned_long *)&local_108);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_118.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_a0,"--string",&local_109);
  local_108.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_a0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"--string\")",(unsigned_long *)&local_118
             ,(unsigned_long *)&local_108);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar,"str","\"mystring\"",&str,(char (*) [9])0x157f77);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST_F(TApp, OneStringAgain) {
    std::string str;
    app.add_option("-s,--string", str);
    args = {"--string", "mystring"};
    run();
    EXPECT_EQ((size_t)1, app.count("-s"));
    EXPECT_EQ((size_t)1, app.count("--string"));
    EXPECT_EQ(str, "mystring");
}